

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDG2Dot.h
# Opt level: O0

void __thiscall
dg::llvmdg::SDG2Dot::dumpParams(SDG2Dot *this,ostream *out,DGParameters *params,string *name)

{
  bool bVar1;
  ostream *poVar2;
  DGArgumentPair *this_00;
  DGNode *pDVar3;
  string *in_RCX;
  DGParameters *in_RDX;
  ostream *in_RSI;
  DGElement *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::sdg::DGNode_*>,_bool> pVar4;
  DGNode *ret;
  DGNode *noret;
  DGNodeArgument *nd_1;
  DGArgumentPair *local_res78;
  params_iterator __end2_1;
  params_iterator __begin2_1;
  DGParameters *__range2_1;
  DGNodeArgument *nd;
  DGArgumentPair *param;
  params_iterator __end2;
  params_iterator __begin2;
  DGParameters *__range2;
  ostream *in_stack_ffffffffffffff08;
  DGNodeArgument *in_stack_ffffffffffffff10;
  SystemDependenceGraph *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff39;
  DGNode *in_stack_ffffffffffffff40;
  _Rb_tree_const_iterator<dg::sdg::DGNode_*> in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  iterator local_70;
  DGParameters *local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  DGNodeArgument *local_50;
  DGNodeArgument *local_48;
  DGArgumentPair *local_40;
  iterator local_38;
  iterator local_30;
  DGParameters *local_28;
  string *local_20;
  DGParameters *local_18;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"    subgraph cluster_params_in_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  std::operator<<(poVar2," {\n");
  poVar2 = std::operator<<(local_10,"      label=\"");
  poVar2 = std::operator<<(poVar2,local_20);
  std::operator<<(poVar2," (input)\"\n");
  local_28 = local_18;
  local_30._M_current =
       (unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_> *)
       sdg::DGParameters::begin((DGParameters *)in_stack_ffffffffffffff08);
  local_38._M_current =
       (unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_> *)
       sdg::DGParameters::end((DGParameters *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    local_40 = sdg::DGParameters::params_iterator::operator*((params_iterator *)0x17bc3f);
    local_50 = sdg::DGArgumentPair::getInputArgument(local_40);
    local_48 = local_50;
    pVar4 = std::
            set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
            ::insert((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                      *)in_stack_ffffffffffffff30,(value_type *)in_RDI);
    local_60 = (_Base_ptr)pVar4.first._M_node;
    local_58 = pVar4.second;
    SystemDependenceGraph::getValue(in_stack_ffffffffffffff30,in_RDI);
    dumpNode((SDG2Dot *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
             (ostream *)in_stack_ffffffffffffff48._M_node,in_stack_ffffffffffffff40,
             (Value *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
             (char *)in_stack_ffffffffffffff30);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
    ::operator++(&local_30);
  }
  std::operator<<(local_10,"    }\n");
  poVar2 = std::operator<<(local_10,"    subgraph cluster_params_out_");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  std::operator<<(poVar2," {\n");
  poVar2 = std::operator<<(local_10,"      label=\"");
  poVar2 = std::operator<<(poVar2,local_20);
  std::operator<<(poVar2," (output)\"\n");
  local_68 = local_18;
  local_70._M_current =
       (unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_> *)
       sdg::DGParameters::begin((DGParameters *)in_stack_ffffffffffffff08);
  sdg::DGParameters::end((DGParameters *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    this_00 = sdg::DGParameters::params_iterator::operator*((params_iterator *)0x17bdd0);
    in_stack_ffffffffffffff10 = sdg::DGArgumentPair::getOutputArgument(this_00);
    std::set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>::
    insert((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
            *)in_stack_ffffffffffffff30,(value_type *)in_RDI);
    in_stack_ffffffffffffff08 = local_10;
    SystemDependenceGraph::getValue(in_stack_ffffffffffffff30,in_RDI);
    dumpNode((SDG2Dot *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
             (ostream *)in_stack_ffffffffffffff48._M_node,in_stack_ffffffffffffff40,
             (Value *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
             (char *)in_stack_ffffffffffffff30);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_*,_std::vector<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>,_std::allocator<std::unique_ptr<dg::sdg::DGArgumentPair,_std::default_delete<dg::sdg::DGArgumentPair>_>_>_>_>
    ::operator++(&local_70);
  }
  pDVar3 = sdg::DGParameters::getNoReturn(local_18);
  if (pDVar3 != (DGNode *)0x0) {
    pVar4 = std::
            set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
            ::insert((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                      *)in_stack_ffffffffffffff30,(value_type *)in_RDI);
    in_stack_ffffffffffffff48 = pVar4.first._M_node;
    in_stack_ffffffffffffff50 = pVar4.second;
    dumpNode((SDG2Dot *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
             (ostream *)in_stack_ffffffffffffff48._M_node,in_stack_ffffffffffffff40,
             (Value *)CONCAT71(in_stack_ffffffffffffff39,in_stack_ffffffffffffff38),
             (char *)in_stack_ffffffffffffff30);
  }
  pDVar3 = sdg::DGParameters::getReturn(local_18);
  if (pDVar3 != (DGNode *)0x0) {
    pVar4 = std::
            set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
            ::insert((set<dg::sdg::DGNode_*,_std::less<dg::sdg::DGNode_*>,_std::allocator<dg::sdg::DGNode_*>_>
                      *)in_stack_ffffffffffffff30,(value_type *)in_RDI);
    dumpNode((SDG2Dot *)CONCAT71(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50),
             (ostream *)in_stack_ffffffffffffff48._M_node,pDVar3,
             (Value *)CONCAT71(in_stack_ffffffffffffff39,pVar4.second),
             (char *)pVar4.first._M_node._M_node);
  }
  std::operator<<(local_10,"    }\n");
  return;
}

Assistant:

void dumpParams(std::ostream &out, sdg::DGParameters &params,
                    const std::string &name) const {
        /// input parameters
        out << "    subgraph cluster_params_in_" << &params << " {\n";
        out << "      label=\"" << name << " (input)\"\n";
        for (auto &param : params) {
            auto &nd = param.getInputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        out << "    }\n";

        /// output parameters
        out << "    subgraph cluster_params_out_" << &params << " {\n";
        out << "      label=\"" << name << " (output)\"\n";
        for (auto &param : params) {
            auto &nd = param.getOutputArgument();
            dumpedNodes.insert(&nd);
            dumpNode(out, nd, _llvmsdg->getValue(&param));
        }
        if (auto *noret = params.getNoReturn()) {
            dumpedNodes.insert(noret);
            dumpNode(out, *noret, nullptr, "noret");
        }
        if (auto *ret = params.getReturn()) {
            dumpedNodes.insert(ret);
            dumpNode(out, *ret, nullptr, "ret");
        }
        out << "    }\n";
    }